

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_oh_make_direct(qpdf_data qpdf,qpdf_oh oh)

{
  anon_class_1_0_00000001 local_39;
  function<void_(QPDFObjectHandle_&)> local_38;
  qpdf_oh local_14;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_14 = oh;
  p_Stack_10 = qpdf;
  std::function<void(QPDFObjectHandle&)>::function<qpdf_oh_make_direct::__0,void>
            ((function<void(QPDFObjectHandle&)> *)&local_38,&local_39);
  do_with_oh_void(qpdf,oh,&local_38);
  std::function<void_(QPDFObjectHandle_&)>::~function(&local_38);
  return;
}

Assistant:

void
qpdf_oh_make_direct(qpdf_data qpdf, qpdf_oh oh)
{
    do_with_oh_void(qpdf, oh, [](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_make_direct");
        o.makeDirect();
    });
}